

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void __thiscall
setup::info::load_entries<setup::run_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::run_entry,_std::allocator<setup::run_entry>_> *result,enum_type entry_type)

{
  pointer prVar1;
  pointer prVar2;
  pointer this_00;
  long lVar3;
  run_entry entry;
  run_entry local_220;
  
  prVar1 = (result->super__Vector_base<setup::run_entry,_std::allocator<setup::run_entry>_>)._M_impl
           .super__Vector_impl_data._M_start;
  prVar2 = (result->super__Vector_base<setup::run_entry,_std::allocator<setup::run_entry>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  this_00 = prVar1;
  if (prVar2 != prVar1) {
    do {
      run_entry::~run_entry(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != prVar2);
    (result->super__Vector_base<setup::run_entry,_std::allocator<setup::run_entry>_>)._M_impl.
    super__Vector_impl_data._M_finish = prVar1;
  }
  if (NoUnknownVersion < entry_type) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)entry_type
               ,0x15);
  }
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w >> ((ulong)entry_type & 0x3f) & 1) == 0) {
    if (count != 0) {
      do {
        local_220.super_item.components._M_dataplus._M_p =
             (pointer)&local_220.super_item.components.field_2;
        local_220.super_item.components._M_string_length = 0;
        local_220.super_item.components.field_2._M_local_buf[0] = '\0';
        local_220.super_item.tasks._M_dataplus._M_p = (pointer)&local_220.super_item.tasks.field_2;
        local_220.super_item.tasks._M_string_length = 0;
        local_220.super_item.tasks.field_2._M_local_buf[0] = '\0';
        local_220.super_item.languages._M_dataplus._M_p =
             (pointer)&local_220.super_item.languages.field_2;
        local_220.super_item.languages._M_string_length = 0;
        local_220.super_item.languages.field_2._M_local_buf[0] = '\0';
        local_220.super_item.check._M_dataplus._M_p = (pointer)&local_220.super_item.check.field_2;
        local_220.super_item.check._M_string_length = 0;
        local_220.super_item.check.field_2._M_local_buf[0] = '\0';
        local_220.super_item.after_install._M_dataplus._M_p =
             (pointer)&local_220.super_item.after_install.field_2;
        local_220.super_item.after_install._M_string_length = 0;
        local_220.super_item.after_install.field_2._M_local_buf[0] = '\0';
        local_220.super_item.before_install._M_dataplus._M_p =
             (pointer)&local_220.super_item.before_install.field_2;
        local_220.super_item.before_install._M_string_length = 0;
        local_220.super_item.before_install.field_2._M_local_buf[0] = '\0';
        local_220.name._M_dataplus._M_p = (pointer)&local_220.name.field_2;
        local_220.name._M_string_length = 0;
        local_220.name.field_2._M_local_buf[0] = '\0';
        local_220.parameters._M_dataplus._M_p = (pointer)&local_220.parameters.field_2;
        local_220.parameters._M_string_length = 0;
        local_220.parameters.field_2._M_local_buf[0] = '\0';
        local_220.working_dir._M_dataplus._M_p = (pointer)&local_220.working_dir.field_2;
        local_220.working_dir._M_string_length = 0;
        local_220.working_dir.field_2._M_local_buf[0] = '\0';
        local_220.run_once_id._M_dataplus._M_p = (pointer)&local_220.run_once_id.field_2;
        local_220.run_once_id._M_string_length = 0;
        local_220.run_once_id.field_2._M_local_buf[0] = '\0';
        local_220.status_message._M_dataplus._M_p = (pointer)&local_220.status_message.field_2;
        local_220.status_message._M_string_length = 0;
        local_220.status_message.field_2._M_local_buf[0] = '\0';
        local_220.verb._M_dataplus._M_p = (pointer)&local_220.verb.field_2;
        local_220.verb._M_string_length = 0;
        local_220.verb.field_2._M_local_buf[0] = '\0';
        local_220.description._M_string_length = 0;
        local_220.description.field_2._M_local_buf[0] = '\0';
        local_220.options._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
        local_220.description._M_dataplus._M_p = (pointer)&local_220.description.field_2;
        run_entry::load(&local_220,is,this);
        run_entry::~run_entry(&local_220);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    std::vector<setup::run_entry,_std::allocator<setup::run_entry>_>::resize(result,count);
    if (count != 0) {
      lVar3 = 0;
      do {
        run_entry::load((run_entry *)
                        ((long)&(((result->
                                  super__Vector_base<setup::run_entry,_std::allocator<setup::run_entry>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->super_item).
                                components._M_dataplus + lVar3),is,this);
        lVar3 = lVar3 + 0x1f0;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}